

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::ConvertAnimationStack(FBXConverter *this,AnimationStack *st)

{
  size_t *this_00;
  long lVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined8 uVar4;
  AnimationCurveNodeList *pAVar5;
  bool bVar6;
  bool bVar7;
  AnimationLayerList *this_01;
  aiAnimation *this_02;
  string *psVar8;
  reference ppAVar9;
  reference ppAVar10;
  Object *pOVar11;
  mapped_type *this_03;
  mapped_type *ppAVar12;
  reference fixed_name;
  size_type sVar13;
  size_type sVar14;
  ulong uVar15;
  void *pvVar16;
  iterator __first1;
  iterator __last1;
  reference ppVar17;
  size_type sVar18;
  aiMeshMorphAnim *this_04;
  ulong *puVar19;
  reference ppVar20;
  uint *puVar21;
  reference pvVar22;
  reference pvVar23;
  double *pdVar24;
  aiMeshMorphKey *paVar25;
  bool bVar26;
  double local_648;
  aiMeshMorphKey *local_600;
  BlendShapeChannel *local_598;
  Object *local_568;
  uint local_534;
  uint32_t i_4;
  aiMeshMorphAnim *channel_1;
  uint c_1;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  aiNodeAnim *channel;
  uint c;
  double stop_time_fps;
  double start_time_fps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  format local_4d0;
  uint local_358;
  uint local_354;
  uint k;
  uint numValuesAndWeights;
  morphKeyData *keyData;
  pair<const_long,_morphKeyData_*> animIt;
  _Self local_330;
  iterator __end5;
  iterator __begin5;
  morphAnimData *__range5;
  uint j;
  aiMeshMorphAnim *meshMorphAnim;
  uint numKeys;
  morphAnimData *animData;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
  morphAnimIt;
  iterator __end4;
  iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
  *__range4;
  uint i;
  uint numMorphMeshChannels;
  exception *anon_var_0;
  value_type *kv;
  iterator __end2_1;
  iterator __begin2_1;
  NodeMap *__range2_1;
  int64_t iStack_258;
  bool has_local_startstop;
  int64_t stop_time;
  int64_t start_time;
  double max_time;
  double min_time;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> node_anims;
  BlendShapeChannel *bsc;
  key_type *local_1f8;
  string *name_1;
  Model *model;
  AnimationCurveNode *node;
  const_iterator __end3;
  const_iterator __begin3;
  AnimationCurveNodeList *__range3;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *local_1b0;
  AnimationCurveNodeList *nodes;
  AnimationLayer *layer;
  const_iterator __end2;
  const_iterator __begin2;
  AnimationLayerList *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
  morphAnimDatas;
  char *prop_whitelist [4];
  LayerMap layer_map;
  NodeMap node_map;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string name;
  aiAnimation *anim;
  AnimationLayerList *layers;
  AnimationStack *st_local;
  FBXConverter *this_local;
  
  this_01 = AnimationStack::Layers(st);
  bVar6 = std::
          vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
          ::empty(this_01);
  if (!bVar6) {
    this_02 = (aiAnimation *)operator_new(0x448);
    aiAnimation::aiAnimation(this_02);
    name.field_2._8_8_ = this_02;
    std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::push_back
              (&this->animations,(value_type *)((long)&name.field_2 + 8));
    psVar8 = FBX::Object::Name_abi_cxx11_(&st->super_Object);
    std::__cxx11::string::string((string *)local_48,(string *)psVar8);
    std::__cxx11::string::substr((ulong)&local_68,(ulong)local_48);
    bVar6 = std::operator==(&local_68,"AnimationStack::");
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar6) {
      std::__cxx11::string::substr((ulong)local_98,(ulong)local_48);
      std::__cxx11::string::operator=((string *)local_48,local_98);
      std::__cxx11::string::~string(local_98);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_48);
      bVar6 = std::operator==(&local_b8,"AnimStack::");
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar6) {
        std::__cxx11::string::substr
                  ((ulong)&node_map._M_t._M_impl.super__Rb_tree_header._M_node_count,(ulong)local_48
                  );
        std::__cxx11::string::operator=
                  ((string *)local_48,
                   (string *)&node_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::__cxx11::string::~string
                  ((string *)&node_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    aiString::Set((aiString *)name.field_2._8_8_,(string *)local_48);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
           *)&layer_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<const_Assimp::FBX::AnimationCurveNode_*,_const_Assimp::FBX::AnimationLayer_*,_std::less<const_Assimp::FBX::AnimationCurveNode_*>,_std::allocator<std::pair<const_Assimp::FBX::AnimationCurveNode_*const,_const_Assimp::FBX::AnimationLayer_*>_>_>
    ::map((map<const_Assimp::FBX::AnimationCurveNode_*,_const_Assimp::FBX::AnimationLayer_*,_std::less<const_Assimp::FBX::AnimationCurveNode_*>,_std::allocator<std::pair<const_Assimp::FBX::AnimationCurveNode_*const,_const_Assimp::FBX::AnimationLayer_*>_>_>
           *)(prop_whitelist + 3));
    morphAnimDatas._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)anon_var_dwarf_c286c8;
    prop_whitelist[0] = "Lcl Rotation";
    prop_whitelist[1] = "Lcl Translation";
    prop_whitelist[2] = "DeformPercent";
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
           *)&__range2);
    __end2 = std::
             vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
             ::begin(this_01);
    layer = (AnimationLayer *)
            std::
            vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>
            ::end(this_01);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_Assimp::FBX::AnimationLayer_*const_*,_std::vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>_>
                                       *)&layer), bVar6) {
      ppAVar9 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::AnimationLayer_*const_*,_std::vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>_>
                ::operator*(&__end2);
      nodes = (AnimationCurveNodeList *)*ppAVar9;
      if ((AnimationLayer *)nodes == (AnimationLayer *)0x0) {
        __assert_fail("layer",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                      ,0x9ba,
                      "void Assimp::FBX::FBXConverter::ConvertAnimationStack(const AnimationStack &)"
                     );
      }
      AnimationLayer::Nodes
                ((AnimationCurveNodeList *)&__range3,(AnimationLayer *)nodes,
                 (char **)&morphAnimDatas._M_t._M_impl.super__Rb_tree_header._M_node_count,4);
      local_1b0 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                   *)&__range3;
      __end3 = std::
               vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
               ::begin((vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                        *)&__range3);
      node = (AnimationCurveNode *)
             std::
             vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             ::end((vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                    *)&__range3);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
                                         *)&node), bVar6) {
        ppAVar10 = __gnu_cxx::
                   __normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
                   ::operator*(&__end3);
        model = (Model *)*ppAVar10;
        if (model == (Model *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                        ,0x9bd,
                        "void Assimp::FBX::FBXConverter::ConvertAnimationStack(const AnimationStack &)"
                       );
        }
        pOVar11 = AnimationCurveNode::Target((AnimationCurveNode *)model);
        if (pOVar11 == (Object *)0x0) {
          local_568 = (Object *)0x0;
        }
        else {
          local_568 = (Object *)__dynamic_cast(pOVar11,&FBX::Object::typeinfo,&Model::typeinfo,0);
        }
        name_1 = (string *)local_568;
        if (local_568 == (Object *)0x0) {
          pOVar11 = AnimationCurveNode::Target((AnimationCurveNode *)model);
          if (pOVar11 == (Object *)0x0) {
            local_598 = (BlendShapeChannel *)0x0;
          }
          else {
            local_598 = (BlendShapeChannel *)
                        __dynamic_cast(pOVar11,&FBX::Object::typeinfo,&BlendShapeChannel::typeinfo,0
                                      );
          }
          node_anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_598;
          if (local_598 != (BlendShapeChannel *)0x0) {
            ProcessMorphAnimDatas
                      (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                             *)&__range2,local_598,(AnimationCurveNode *)model);
          }
        }
        else {
          psVar8 = FBX::Object::Name_abi_cxx11_(local_568);
          FixNodeName((string *)&bsc,this,psVar8);
          local_1f8 = (key_type *)&bsc;
          this_03 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                                  *)&layer_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 local_1f8);
          std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::push_back(this_03,(value_type *)&model);
          pAVar5 = nodes;
          ppAVar12 = std::
                     map<const_Assimp::FBX::AnimationCurveNode_*,_const_Assimp::FBX::AnimationLayer_*,_std::less<const_Assimp::FBX::AnimationCurveNode_*>,_std::allocator<std::pair<const_Assimp::FBX::AnimationCurveNode_*const,_const_Assimp::FBX::AnimationLayer_*>_>_>
                     ::operator[]((map<const_Assimp::FBX::AnimationCurveNode_*,_const_Assimp::FBX::AnimationLayer_*,_std::less<const_Assimp::FBX::AnimationCurveNode_*>,_std::allocator<std::pair<const_Assimp::FBX::AnimationCurveNode_*const,_const_Assimp::FBX::AnimationLayer_*>_>_>
                                   *)(prop_whitelist + 3),(key_type *)&model);
          *ppAVar12 = (mapped_type)pAVar5;
          std::__cxx11::string::~string((string *)&bsc);
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::FBX::AnimationCurveNode_*const_*,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>
        ::operator++(&__end3);
      }
      std::
      vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
      ::~vector((vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                 *)&__range3);
      __gnu_cxx::
      __normal_iterator<const_Assimp::FBX::AnimationLayer_*const_*,_std::vector<const_Assimp::FBX::AnimationLayer_*,_std::allocator<const_Assimp::FBX::AnimationLayer_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::vector
              ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time);
    max_time = 10000000000.0;
    start_time = -0x3dfd5fa0e0000000;
    stop_time = AnimationStack::LocalStart(st);
    iStack_258 = AnimationStack::LocalStop(st);
    bVar6 = stop_time == 0;
    bVar26 = iStack_258 == 0;
    if (bVar6 && bVar26) {
      stop_time = -0x7fffffffffffb1df;
      iStack_258 = 0x7fffffffffffb1df;
    }
    this_00 = &layer_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                        *)this_00);
    kv = (value_type *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                *)this_00);
    while (bVar7 = std::operator!=(&__end2_1,(_Self *)&kv), bVar7) {
      fixed_name = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
                   ::operator*(&__end2_1);
      GenerateNodeAnimations
                (this,(vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time,
                 &fixed_name->first,&fixed_name->second,(LayerMap *)(prop_whitelist + 3),stop_time,
                 iStack_258,(double *)&start_time,&max_time);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>
      ::operator++(&__end2_1);
    }
    sVar13 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                       ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time);
    if ((sVar13 == 0) &&
       (sVar14 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                 ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                         *)&__range2), uVar4 = name.field_2._8_8_, sVar14 == 0)) {
      if (name.field_2._8_8_ != 0) {
        aiAnimation::~aiAnimation((aiAnimation *)name.field_2._8_8_);
        operator_delete((void *)uVar4,0x448);
      }
      std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::pop_back(&this->animations);
      std::operator+(&local_4f0,"ignoring empty AnimationStack (using IK?): ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_4d0,
                 &local_4f0);
      LogFunctions<Assimp::FBXImporter>::LogInfo(&local_4d0);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_4d0);
      std::__cxx11::string::~string((string *)&local_4f0);
    }
    else {
      sVar13 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                         ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time);
      if (sVar13 != 0) {
        sVar13 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                           ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = sVar13;
        uVar15 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar15 = 0xffffffffffffffff;
        }
        pvVar16 = operator_new__(uVar15);
        memset(pvVar16,0,uVar15);
        *(void **)(name.field_2._8_8_ + 0x420) = pvVar16;
        sVar13 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                           ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time);
        *(int *)(name.field_2._8_8_ + 0x418) = (int)sVar13;
        __first1 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::begin
                             ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time);
        __last1 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::end
                            ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time);
        std::
        swap_ranges<__gnu_cxx::__normal_iterator<aiNodeAnim**,std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>>,aiNodeAnim**>
                  ((__normal_iterator<aiNodeAnim_**,_std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>_>
                    )__first1._M_current,
                   (__normal_iterator<aiNodeAnim_**,_std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>_>
                    )__last1._M_current,*(aiNodeAnim ***)(name.field_2._8_8_ + 0x420));
      }
      sVar14 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
               ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                       *)&__range2);
      if (sVar14 != 0) {
        sVar14 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                 ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                         *)&__range2);
        pvVar16 = operator_new__((sVar14 & 0xffffffff) << 3);
        *(void **)(name.field_2._8_8_ + 0x440) = pvVar16;
        *(int *)(name.field_2._8_8_ + 0x438) = (int)sVar14;
        __range4._0_4_ = 0;
        __end4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                          *)&__range2);
        morphAnimIt.second =
             (map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                       *)&__range2);
        while (bVar7 = std::operator!=(&__end4,(_Self *)&morphAnimIt.second), bVar7) {
          ppVar17 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>
                    ::operator*(&__end4);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
                  *)&animData,ppVar17);
          uVar4 = morphAnimIt.first.field_2._8_8_;
          sVar18 = std::
                   map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                   ::size((map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                           *)morphAnimIt.first.field_2._8_8_);
          this_04 = (aiMeshMorphAnim *)operator_new(0x410);
          aiMeshMorphAnim::aiMeshMorphAnim(this_04);
          aiString::Set((aiString *)this_04,(string *)&animData);
          this_04->mNumKeys = (uint)sVar18;
          uVar15 = sVar18 & 0xffffffff;
          puVar19 = (ulong *)operator_new__(uVar15 << 5 | 8);
          *puVar19 = uVar15;
          paVar25 = (aiMeshMorphKey *)(puVar19 + 1);
          if (uVar15 != 0) {
            local_600 = paVar25;
            do {
              aiMeshMorphKey::aiMeshMorphKey(local_600);
              local_600 = local_600 + 1;
            } while (local_600 != paVar25 + uVar15);
          }
          this_04->mKeys = paVar25;
          __range5._4_4_ = 0;
          __end5 = std::
                   map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                   ::begin((map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                            *)uVar4);
          local_330._M_node =
               (_Base_ptr)
               std::
               map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
               ::end((map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>
                      *)uVar4);
          while (bVar7 = std::operator!=(&__end5,&local_330), bVar7) {
            ppVar20 = std::_Rb_tree_iterator<std::pair<const_long,_morphKeyData_*>_>::operator*
                                (&__end5);
            keyData = (morphKeyData *)ppVar20->first;
            _k = ppVar20->second;
            animIt.first = (long)_k;
            sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&_k->values);
            local_354 = (uint)sVar13;
            this_04->mKeys[__range5._4_4_].mNumValuesAndWeights = local_354;
            puVar21 = (uint *)operator_new__((sVar13 & 0xffffffff) << 2);
            this_04->mKeys[__range5._4_4_].mValues = puVar21;
            pdVar24 = (double *)operator_new__((ulong)local_354 << 3);
            this_04->mKeys[__range5._4_4_].mWeights = pdVar24;
            this_04->mKeys[__range5._4_4_].mTime =
                 ((double)(long)keyData / 46186158000.0) * this->anim_fps;
            for (local_358 = 0; local_358 < local_354; local_358 = local_358 + 1) {
              pvVar22 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                                  (&_k->values,(ulong)local_358);
              this_04->mKeys[__range5._4_4_].mValues[local_358] = *pvVar22;
              pvVar23 = std::vector<float,_std::allocator<float>_>::at
                                  (&_k->weights,(ulong)local_358);
              this_04->mKeys[__range5._4_4_].mWeights[local_358] = (double)*pvVar23;
            }
            __range5._4_4_ = __range5._4_4_ + 1;
            std::_Rb_tree_iterator<std::pair<const_long,_morphKeyData_*>_>::operator++(&__end5);
          }
          *(aiMeshMorphAnim **)(*(long *)(name.field_2._8_8_ + 0x440) + (ulong)(uint)__range4 * 8) =
               this_04;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
                   *)&animData);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>
          ::operator++(&__end4);
          __range4._0_4_ = (uint)__range4 + 1;
        }
      }
      if (bVar6 && bVar26) {
        local_648 = (double)start_time;
        dVar3 = max_time;
      }
      else {
        local_648 = ((double)iStack_258 / 46186158000.0) * this->anim_fps;
        dVar3 = ((double)stop_time / 46186158000.0) * this->anim_fps;
      }
      for (channel._4_4_ = 0; channel._4_4_ < *(uint *)(name.field_2._8_8_ + 0x418);
          channel._4_4_ = channel._4_4_ + 1) {
        lVar1 = *(long *)(*(long *)(name.field_2._8_8_ + 0x420) + (ulong)channel._4_4_ * 8);
        for (i_3 = 0; i_3 < *(uint *)(lVar1 + 0x404); i_3 = i_3 + 1) {
          pdVar24 = (double *)(*(long *)(lVar1 + 0x408) + (ulong)i_3 * 0x18);
          *pdVar24 = *pdVar24 - dVar3;
        }
        for (c_1 = 0; c_1 < *(uint *)(lVar1 + 0x410); c_1 = c_1 + 1) {
          pdVar24 = (double *)(*(long *)(lVar1 + 0x418) + (ulong)c_1 * 0x18);
          *pdVar24 = *pdVar24 - dVar3;
        }
        for (channel_1._4_4_ = 0; channel_1._4_4_ < *(uint *)(lVar1 + 0x420);
            channel_1._4_4_ = channel_1._4_4_ + 1) {
          pdVar24 = (double *)(*(long *)(lVar1 + 0x428) + (ulong)channel_1._4_4_ * 0x18);
          *pdVar24 = *pdVar24 - dVar3;
        }
      }
      for (channel_1._0_4_ = 0; (uint)channel_1 < *(uint *)(name.field_2._8_8_ + 0x438);
          channel_1._0_4_ = (uint)channel_1 + 1) {
        lVar1 = *(long *)(*(long *)(name.field_2._8_8_ + 0x440) + (ulong)(uint)channel_1 * 8);
        for (local_534 = 0; local_534 < *(uint *)(lVar1 + 0x404); local_534 = local_534 + 1) {
          pdVar24 = (double *)(*(long *)(lVar1 + 0x408) + (ulong)local_534 * 0x20);
          *pdVar24 = *pdVar24 - dVar3;
        }
      }
      *(double *)(name.field_2._8_8_ + 0x408) = local_648 - dVar3;
      *(double *)(name.field_2._8_8_ + 0x410) = this->anim_fps;
    }
    std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::~vector
              ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)&min_time);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
            *)&__range2);
    std::
    map<const_Assimp::FBX::AnimationCurveNode_*,_const_Assimp::FBX::AnimationLayer_*,_std::less<const_Assimp::FBX::AnimationCurveNode_*>,_std::allocator<std::pair<const_Assimp::FBX::AnimationCurveNode_*const,_const_Assimp::FBX::AnimationLayer_*>_>_>
    ::~map((map<const_Assimp::FBX::AnimationCurveNode_*,_const_Assimp::FBX::AnimationLayer_*,_std::less<const_Assimp::FBX::AnimationCurveNode_*>,_std::allocator<std::pair<const_Assimp::FBX::AnimationCurveNode_*const,_const_Assimp::FBX::AnimationLayer_*>_>_>
            *)(prop_whitelist + 3));
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
            *)&layer_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void FBXConverter::ConvertAnimationStack(const AnimationStack& st)
        {
            const AnimationLayerList& layers = st.Layers();
            if (layers.empty()) {
                return;
            }

            aiAnimation* const anim = new aiAnimation();
            animations.push_back(anim);

            // strip AnimationStack:: prefix
            std::string name = st.Name();
            if (name.substr(0, 16) == "AnimationStack::") {
                name = name.substr(16);
            }
            else if (name.substr(0, 11) == "AnimStack::") {
                name = name.substr(11);
            }

            anim->mName.Set(name);

            // need to find all nodes for which we need to generate node animations -
            // it may happen that we need to merge multiple layers, though.
            NodeMap node_map;

            // reverse mapping from curves to layers, much faster than querying
            // the FBX DOM for it.
            LayerMap layer_map;

            const char* prop_whitelist[] = {
                "Lcl Scaling",
                "Lcl Rotation",
                "Lcl Translation",
                "DeformPercent"
            };

            std::map<std::string, morphAnimData*> morphAnimDatas;

            for (const AnimationLayer* layer : layers) {
                ai_assert(layer);
                const AnimationCurveNodeList& nodes = layer->Nodes(prop_whitelist, 4);
                for (const AnimationCurveNode* node : nodes) {
                    ai_assert(node);
                    const Model* const model = dynamic_cast<const Model*>(node->Target());
                    if (model) {
                        const std::string& name = FixNodeName(model->Name());
                        node_map[name].push_back(node);
                        layer_map[node] = layer;
                        continue;
                    }
                    const BlendShapeChannel* const bsc = dynamic_cast<const BlendShapeChannel*>(node->Target());
                    if (bsc) {
                        ProcessMorphAnimDatas(&morphAnimDatas, bsc, node);
                    }
                }
            }

            // generate node animations
            std::vector<aiNodeAnim*> node_anims;

            double min_time = 1e10;
            double max_time = -1e10;

            int64_t start_time = st.LocalStart();
            int64_t stop_time = st.LocalStop();
            bool has_local_startstop = start_time != 0 || stop_time != 0;
            if (!has_local_startstop) {
                // no time range given, so accept every keyframe and use the actual min/max time
                // the numbers are INT64_MIN/MAX, the 20000 is for safety because GenerateNodeAnimations uses an epsilon of 10000
                start_time = -9223372036854775807ll + 20000;
                stop_time = 9223372036854775807ll - 20000;
            }

            try {
                for (const NodeMap::value_type& kv : node_map) {
                    GenerateNodeAnimations(node_anims,
                        kv.first,
                        kv.second,
                        layer_map,
                        start_time, stop_time,
                        max_time,
                        min_time);
                }
            }
            catch (std::exception&) {
                std::for_each(node_anims.begin(), node_anims.end(), Util::delete_fun<aiNodeAnim>());
                throw;
            }

            if (node_anims.size() || morphAnimDatas.size()) {
                if (node_anims.size()) {
                    anim->mChannels = new aiNodeAnim*[node_anims.size()]();
                    anim->mNumChannels = static_cast<unsigned int>(node_anims.size());
                    std::swap_ranges(node_anims.begin(), node_anims.end(), anim->mChannels);
                }
                if (morphAnimDatas.size()) {
                    unsigned int numMorphMeshChannels = static_cast<unsigned int>(morphAnimDatas.size());
                    anim->mMorphMeshChannels = new aiMeshMorphAnim*[numMorphMeshChannels];
                    anim->mNumMorphMeshChannels = numMorphMeshChannels;
                    unsigned int i = 0;
                    for (auto morphAnimIt : morphAnimDatas) {
                        morphAnimData* animData = morphAnimIt.second;
                        unsigned int numKeys = static_cast<unsigned int>(animData->size());
                        aiMeshMorphAnim* meshMorphAnim = new aiMeshMorphAnim();
                        meshMorphAnim->mName.Set(morphAnimIt.first);
                        meshMorphAnim->mNumKeys = numKeys;
                        meshMorphAnim->mKeys = new aiMeshMorphKey[numKeys];
                        unsigned int j = 0;
                        for (auto animIt : *animData) {
                            morphKeyData* keyData = animIt.second;
                            unsigned int numValuesAndWeights = static_cast<unsigned int>(keyData->values.size());
                            meshMorphAnim->mKeys[j].mNumValuesAndWeights = numValuesAndWeights;
                            meshMorphAnim->mKeys[j].mValues = new unsigned int[numValuesAndWeights];
                            meshMorphAnim->mKeys[j].mWeights = new double[numValuesAndWeights];
                            meshMorphAnim->mKeys[j].mTime = CONVERT_FBX_TIME(animIt.first) * anim_fps;
                            for (unsigned int k = 0; k < numValuesAndWeights; k++) {
                                meshMorphAnim->mKeys[j].mValues[k] = keyData->values.at(k);
                                meshMorphAnim->mKeys[j].mWeights[k] = keyData->weights.at(k);
                            }
                            j++;
                        }
                        anim->mMorphMeshChannels[i++] = meshMorphAnim;
                    }
                }
            }
            else {
                // empty animations would fail validation, so drop them
                delete anim;
                animations.pop_back();
                FBXImporter::LogInfo("ignoring empty AnimationStack (using IK?): " + name);
                return;
            }

            double start_time_fps = has_local_startstop ? (CONVERT_FBX_TIME(start_time) * anim_fps) : min_time;
            double stop_time_fps = has_local_startstop ? (CONVERT_FBX_TIME(stop_time) * anim_fps) : max_time;

            // adjust relative timing for animation
            for (unsigned int c = 0; c < anim->mNumChannels; c++) {
                aiNodeAnim* channel = anim->mChannels[c];
                for (uint32_t i = 0; i < channel->mNumPositionKeys; i++) {
                    channel->mPositionKeys[i].mTime -= start_time_fps;
                }
                for (uint32_t i = 0; i < channel->mNumRotationKeys; i++) {
                    channel->mRotationKeys[i].mTime -= start_time_fps;
                }
                for (uint32_t i = 0; i < channel->mNumScalingKeys; i++) {
                    channel->mScalingKeys[i].mTime -= start_time_fps;
                }
            }
            for (unsigned int c = 0; c < anim->mNumMorphMeshChannels; c++) {
                aiMeshMorphAnim* channel = anim->mMorphMeshChannels[c];
                for (uint32_t i = 0; i < channel->mNumKeys; i++) {
                    channel->mKeys[i].mTime -= start_time_fps;
                }
            }

            // for some mysterious reason, mDuration is simply the maximum key -- the
            // validator always assumes animations to start at zero.
            anim->mDuration = stop_time_fps - start_time_fps;
            anim->mTicksPerSecond = anim_fps;
        }